

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lzham_polar_codes.cpp
# Opt level: O3

bool lzham::generate_polar_codes
               (void *pContext,uint num_syms,uint16 *pFreq,uint8 *pCodesizes,uint *max_code_size,
               uint *total_freq_ret)

{
  ushort *puVar1;
  int *piVar2;
  ushort uVar3;
  ushort uVar4;
  int iVar5;
  ushort uVar6;
  bool bVar7;
  bool bVar8;
  bool bVar9;
  uint i;
  ulong uVar10;
  long lVar11;
  uint uVar12;
  uint uVar13;
  long lVar14;
  uint uVar15;
  ushort *puVar16;
  ulong uVar17;
  sym_freq_conflict *pSF;
  uint uVar18;
  sym_freq_conflict *psVar19;
  uint uVar20;
  uint hist [512];
  uint auStack_c38 [256];
  int local_838 [256];
  uint local_438 [258];
  
  if (num_syms - 1 < 600) {
    uVar10 = 0;
    uVar18 = 0;
    uVar17 = 0;
    do {
      uVar3 = pFreq[uVar10];
      if (uVar3 == 0) {
        pCodesizes[uVar10] = '\0';
      }
      else {
        uVar18 = uVar18 + uVar3;
        *(short *)((long)pContext + uVar17 * 4 + 2) = (short)uVar10;
        *(ushort *)((long)pContext + uVar17 * 4) = uVar3;
        uVar17 = (ulong)((int)uVar17 + 1);
      }
      uVar10 = uVar10 + 1;
    } while (num_syms != uVar10);
    *total_freq_ret = uVar18;
    uVar20 = (uint)uVar17;
    if (uVar20 == 1) {
      pCodesizes[*(ushort *)((long)pContext + 2)] = '\x01';
    }
    else {
      memset(local_838,0,0x800);
      bVar8 = true;
      bVar9 = true;
      uVar10 = (ulong)(uVar20 & 0xfffffffe);
      if ((uVar17 & 0xfffffffe) != 0) {
        puVar1 = (ushort *)((long)pContext + uVar10 * 4);
        puVar16 = (ushort *)pContext;
        do {
          uVar3 = *puVar16;
          uVar4 = puVar16[2];
          local_838[uVar3 & 0xff] = local_838[uVar3 & 0xff] + 1;
          piVar2 = (int *)((long)local_438 + (ulong)(uVar3 >> 6 & 0xfffffffc));
          *piVar2 = *piVar2 + 1;
          local_838[uVar4 & 0xff] = local_838[uVar4 & 0xff] + 1;
          piVar2 = (int *)((long)local_438 + (ulong)(uVar4 >> 6 & 0xfffffffc));
          *piVar2 = *piVar2 + 1;
          puVar16 = puVar16 + 4;
        } while (puVar16 != puVar1);
        bVar9 = true;
        if ((uVar17 & 1) != 0) {
          uVar3 = *puVar1;
          local_838[(byte)uVar3] = local_838[(byte)uVar3] + 1;
          piVar2 = (int *)((long)local_438 + (ulong)(uVar3 >> 6 & 0xfffffffc));
          *piVar2 = *piVar2 + 1;
          bVar9 = false;
        }
      }
      lVar11 = 0;
      psVar19 = (sym_freq_conflict *)((long)pContext + 0x960);
      do {
        pSF = psVar19;
        uVar17 = 0xfffffffffffffffe;
        uVar12 = 0;
        do {
          auStack_c38[uVar17 + 2] = uVar12;
          iVar5 = local_838[lVar11 * 0x100 + uVar17 + 2];
          auStack_c38[uVar17 + 3] = uVar12 + iVar5;
          uVar12 = uVar12 + iVar5 + local_838[lVar11 * 0x100 + uVar17 + 3];
          uVar17 = uVar17 + 2;
        } while (uVar17 < 0xfe);
        psVar19 = (sym_freq_conflict *)pContext;
        if (uVar10 != 0) {
          psVar19 = (sym_freq_conflict *)((long)pContext + uVar10 * 4);
          lVar14 = 0;
          do {
            uVar3 = *(ushort *)((long)&((sym_freq_conflict *)pContext)->m_freq + lVar14);
            uVar4 = *(ushort *)((long)&((sym_freq_conflict *)((long)pContext + 4))->m_freq + lVar14)
            ;
            uVar6 = uVar3 >> 8;
            if (bVar8) {
              uVar6 = uVar3;
            }
            uVar3 = uVar4 >> 8;
            if (bVar8) {
              uVar3 = uVar4;
            }
            uVar13 = uVar6 & 0xff;
            uVar15 = uVar3 & 0xff;
            uVar12 = auStack_c38[uVar13];
            if (uVar13 == uVar15) {
              auStack_c38[uVar13] = uVar12 + 2;
              pSF[uVar12] = *(sym_freq_conflict *)
                             ((long)&((sym_freq_conflict *)pContext)->m_freq + lVar14);
              uVar13 = uVar12 + 1;
            }
            else {
              auStack_c38[uVar13] = uVar12 + 1;
              uVar13 = auStack_c38[uVar15];
              auStack_c38[uVar15] = uVar13 + 1;
              pSF[uVar12] = *(sym_freq_conflict *)
                             ((long)&((sym_freq_conflict *)pContext)->m_freq + lVar14);
            }
            pSF[uVar13] = *(sym_freq_conflict *)
                           ((long)&((sym_freq_conflict *)((long)pContext + 4))->m_freq + lVar14);
            lVar14 = lVar14 + 8;
          } while ((ulong)(uVar20 & 0xfffffffe) << 2 != lVar14);
        }
        if (!bVar9) {
          uVar13 = psVar19->m_freq >> (sbyte)((int)lVar11 << 3) & 0xff;
          uVar12 = auStack_c38[uVar13];
          auStack_c38[uVar13] = uVar12 + 1;
          pSF[uVar12] = *psVar19;
        }
        lVar11 = 1;
        bVar7 = (bool)(local_438[0] != uVar20 & bVar8);
        bVar8 = false;
        psVar19 = (sym_freq_conflict *)pContext;
        pContext = pSF;
      } while (bVar7);
      generate_polar_codes(num_syms,pSF,pCodesizes,max_code_size);
    }
  }
  return num_syms - 1 < 600;
}

Assistant:

bool generate_polar_codes(void* pContext, uint num_syms, const uint16* pFreq, uint8* pCodesizes, uint& max_code_size, uint& total_freq_ret)
   {
      if ((!num_syms) || (num_syms > cPolarMaxSupportedSyms))
         return false;

      polar_work_tables& state = *static_cast<polar_work_tables*>(pContext);;

      uint max_freq = 0;
      uint total_freq = 0;

      uint num_used_syms = 0;
      for (uint i = 0; i < num_syms; i++)
      {
         uint freq = pFreq[i];

         if (!freq)
            pCodesizes[i] = 0;
         else
         {
            total_freq += freq;
            max_freq = math::maximum(max_freq, freq);

            sym_freq& sf = state.syms0[num_used_syms];
            sf.m_sym = static_cast<uint16>(i);
            sf.m_freq = static_cast<uint16>(freq);
            num_used_syms++;
         }            
      }

      total_freq_ret = total_freq;

      if (num_used_syms == 1)
      {
         pCodesizes[state.syms0[0].m_sym] = 1;
      }
      else
      {
         sym_freq* syms = radix_sort_syms(num_used_syms, state.syms0, state.syms1);
         
#if LZHAM_USE_SHANNON_FANO_CODES
         generate_shannon_fano_codes(num_syms, syms, total_freq, pCodesizes, max_code_size);
#elif LZHAM_USE_FYFFE_CODES         
         generate_fyffe_codes(num_syms, syms, pCodesizes, max_code_size);
#else
         generate_polar_codes(num_syms, syms, pCodesizes, max_code_size);
#endif         
      }

      return true;
   }